

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O0

void print(bool **arr,string *s)

{
  ostream *this;
  int local_20;
  int local_1c;
  int j;
  int i;
  string *s_local;
  bool **arr_local;
  
  this = std::operator<<((ostream *)&std::cout,(string *)s);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  for (local_1c = 1; local_1c <= bsize; local_1c = local_1c + 1) {
    for (local_20 = 1; local_20 <= bsize; local_20 = local_20 + 1) {
      std::ostream::operator<<(&std::cout,(bool)(arr[local_1c][local_20] & 1));
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void print(bool **arr, const string &s) {
    cout << s << endl;
    for (int i = 1; i <= bsize; i++) {
        for (int j = 1; j <= bsize; j++) {
            cout << arr[i][j];
        }
        cout << endl;
    }
}